

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::anon_unknown_0::ExtensionSetTest_SwapExtension_Test::TestBody
          (ExtensionSetTest_SwapExtension_Test *this)

{
  ExtensionSet *pEVar1;
  bool bVar2;
  Reflection *this_00;
  pointer *__ptr;
  char *in_R9;
  pointer *__ptr_1;
  Metadata MVar3;
  AssertionResult gtest_ar_;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  TestAllExtensions message1;
  TestAllExtensions message2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_e8;
  AssertHelper local_e0;
  internal local_d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  undefined1 local_c8 [32];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_a8;
  undefined1 local_88 [48];
  undefined1 local_58 [48];
  
  proto2_unittest::TestAllExtensions::TestAllExtensions((TestAllExtensions *)local_88,(Arena *)0x0);
  proto2_unittest::TestAllExtensions::TestAllExtensions((TestAllExtensions *)local_58,(Arena *)0x0);
  TestUtil::SetAllExtensions<proto2_unittest::TestAllExtensions>((TestAllExtensions *)local_88);
  local_a8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MVar3 = proto2_unittest::TestAllExtensions::GetMetadata
                    ((TestAllExtensions *)proto2_unittest::_TestAllExtensions_default_instance_);
  this_00 = MVar3.reflection;
  Reflection::SwapFields(this_00,(Message *)local_88,(Message *)local_58,&local_a8);
  TestUtil::ExpectAllExtensionsSet<proto2_unittest::TestAllExtensions>
            ((TestAllExtensions *)local_88);
  TestUtil::ExpectExtensionsClear<proto2_unittest::TestAllExtensions>((TestAllExtensions *)local_58)
  ;
  local_c8._0_8_ = Reflection::FindKnownExtensionByNumber(this_00,0xc);
  std::
  vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
  ::emplace_back<google::protobuf::FieldDescriptor_const*>
            ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
              *)&local_a8,(FieldDescriptor **)local_c8);
  local_c8._0_8_ = Reflection::FindKnownExtensionByNumber(this_00,0x19);
  std::
  vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
  ::emplace_back<google::protobuf::FieldDescriptor_const*>
            ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
              *)&local_a8,(FieldDescriptor **)local_c8);
  Reflection::SwapFields(this_00,(Message *)local_88,(Message *)local_58,&local_a8);
  pEVar1 = (ExtensionSet *)(local_88 + 0x10);
  local_d8[0] = (internal)ExtensionSet::Has(pEVar1,proto2_unittest::optional_int32_extension);
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_d8[0]) {
    testing::Message::Message((Message *)&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,local_d8,
               (AssertionResult *)"message1.HasExtension(unittest::optional_int32_extension)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x143,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((FieldDescriptor *)local_c8._0_8_ != (FieldDescriptor *)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    if (local_e8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_e8._M_head_impl + 8))();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  bVar2 = ExtensionSet::Has(pEVar1,proto2_unittest::optional_double_extension);
  local_d8[0] = (internal)!bVar2;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,local_d8,
               (AssertionResult *)"message1.HasExtension(unittest::optional_double_extension)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x144,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((FieldDescriptor *)local_c8._0_8_ != (FieldDescriptor *)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    if (local_e8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_e8._M_head_impl + 8))();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  bVar2 = ExtensionSet::Has(pEVar1,proto2_unittest::optional_cord_extension);
  local_d8[0] = (internal)!bVar2;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,local_d8,
               (AssertionResult *)"message1.HasExtension(unittest::optional_cord_extension)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x145,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((FieldDescriptor *)local_c8._0_8_ != (FieldDescriptor *)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    if (local_e8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_e8._M_head_impl + 8))();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  pEVar1 = (ExtensionSet *)(local_58 + 0x10);
  bVar2 = ExtensionSet::Has(pEVar1,proto2_unittest::optional_int32_extension);
  local_d8[0] = (internal)!bVar2;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,local_d8,
               (AssertionResult *)"message2.HasExtension(unittest::optional_int32_extension)","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x147,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((FieldDescriptor *)local_c8._0_8_ != (FieldDescriptor *)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    if (local_e8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_e8._M_head_impl + 8))();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  local_d8[0] = (internal)ExtensionSet::Has(pEVar1,proto2_unittest::optional_double_extension);
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_d8[0]) {
    testing::Message::Message((Message *)&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,local_d8,
               (AssertionResult *)"message2.HasExtension(unittest::optional_double_extension)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x148,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((FieldDescriptor *)local_c8._0_8_ != (FieldDescriptor *)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    if (local_e8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_e8._M_head_impl + 8))();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  local_d8[0] = (internal)ExtensionSet::Has(pEVar1,proto2_unittest::optional_cord_extension);
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_d8[0]) {
    testing::Message::Message((Message *)&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,local_d8,
               (AssertionResult *)"message2.HasExtension(unittest::optional_cord_extension)","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x149,(char *)local_c8._0_8_);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((FieldDescriptor *)local_c8._0_8_ != (FieldDescriptor *)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    if (local_e8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_e8._M_head_impl + 8))();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  if (local_a8.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  proto2_unittest::TestAllExtensions::~TestAllExtensions((TestAllExtensions *)local_58);
  proto2_unittest::TestAllExtensions::~TestAllExtensions((TestAllExtensions *)local_88);
  return;
}

Assistant:

TEST(ExtensionSetTest, SwapExtension) {
  unittest::TestAllExtensions message1;
  unittest::TestAllExtensions message2;

  TestUtil::SetAllExtensions(&message1);
  std::vector<const FieldDescriptor*> fields;

  // Swap empty fields.
  const Reflection* reflection = message1.GetReflection();
  reflection->SwapFields(&message1, &message2, fields);
  TestUtil::ExpectAllExtensionsSet(message1);
  TestUtil::ExpectExtensionsClear(message2);

  // Swap two extensions.
  fields.push_back(reflection->FindKnownExtensionByNumber(12));
  fields.push_back(reflection->FindKnownExtensionByNumber(25));
  reflection->SwapFields(&message1, &message2, fields);

  EXPECT_TRUE(message1.HasExtension(unittest::optional_int32_extension));
  EXPECT_FALSE(message1.HasExtension(unittest::optional_double_extension));
  EXPECT_FALSE(message1.HasExtension(unittest::optional_cord_extension));

  EXPECT_FALSE(message2.HasExtension(unittest::optional_int32_extension));
  EXPECT_TRUE(message2.HasExtension(unittest::optional_double_extension));
  EXPECT_TRUE(message2.HasExtension(unittest::optional_cord_extension));
}